

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hatch.cpp
# Opt level: O0

bool __thiscall ON_HatchLine::IsValid(ON_HatchLine *this,ON_TextLog *text_log)

{
  bool bVar1;
  bool rc;
  ON_TextLog *text_log_local;
  ON_HatchLine *this_local;
  
  if (0.0 <= this->m_angle_radians) {
    if (this->m_angle_radians <= 6.283185307179586 && this->m_angle_radians != 6.283185307179586) {
      bVar1 = ON_2dPoint::IsValid(&this->m_base);
      if (bVar1) {
        bVar1 = ON_2dVector::IsValid(&this->m_offset);
        if (bVar1) {
          this_local._7_1_ = true;
        }
        else {
          if (text_log != (ON_TextLog *)0x0) {
            ON_TextLog::Print(text_log,"Offset is not a valid vector.\n");
          }
          this_local._7_1_ = false;
        }
      }
      else {
        if (text_log != (ON_TextLog *)0x0) {
          ON_TextLog::Print(text_log,"Base is not a valid point.\n");
        }
        this_local._7_1_ = false;
      }
    }
    else {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,"Angle ( %lf) must be < 2*Pi.\n",this->m_angle_radians);
      }
      this_local._7_1_ = false;
    }
  }
  else {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"Angle ( %lf) must be >= 0.0\n",this->m_angle_radians);
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_HatchLine::IsValid( ON_TextLog* text_log) const
{
  bool rc = m_angle_radians >= 0.0;
  if( !rc)
  {
    if( text_log)
      text_log->Print( "Angle ( %lf) must be >= 0.0\n", m_angle_radians);
    return false;
  }
  rc = m_angle_radians < ON_PI * 2.0;
  if( !rc)
  {
    if( text_log)
      text_log->Print( "Angle ( %lf) must be < 2*Pi.\n", m_angle_radians);
    return false;
  }
  rc = m_base.IsValid();
  if( !rc)
  {
    if( text_log)
      text_log->Print( "Base is not a valid point.\n");
    return false;
  }
  rc = m_offset.IsValid();
  if( !rc)
  {
    if( text_log)
      text_log->Print( "Offset is not a valid vector.\n");
    return false;
  }
  return true;
}